

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu_api_test.c
# Opt level: O0

RK_S32 vpu_decode_demo(VpuApiDemoCmdContext_t *cmd)

{
  RK_U8 *pRVar1;
  RK_S32 RVar2;
  uint uVar3;
  long lVar4;
  void *pvVar5;
  uint uVar6;
  char *pcVar7;
  bool bVar8;
  RK_U32 frameSize;
  RK_U32 hAlign16;
  RK_U32 wAlign16;
  RK_U32 extraSize;
  RK_U8 *pExtra;
  RK_S64 fakeTimeUs;
  VPU_FRAME *frame;
  DecoderOut_t *pOut;
  VideoPacket_t *pkt;
  VideoPacket_t demoPkt;
  DecoderOut_t decOut;
  RK_U32 frame_count;
  RK_S32 ret;
  RK_S32 pkt_size;
  RK_S32 fileSize;
  FILE *pOutFile;
  FILE *pInFile;
  VpuApiDemoCmdContext_t *cmd_local;
  
  pOutFile = (FILE *)0x0;
  _pkt_size = (FILE *)0x0;
  ret = 0;
  frame_count = 0;
  decOut.nFlags = 0;
  pOut = (DecoderOut_t *)0x0;
  frame = (VPU_FRAME *)0x0;
  fakeTimeUs = 0;
  pExtra = (RK_U8 *)0x0;
  _wAlign16 = (RK_U8 *)0x0;
  hAlign16 = 0;
  if (cmd == (VpuApiDemoCmdContext_t *)0x0) {
    return -1;
  }
  pInFile = (FILE *)cmd;
  if ((((cmd->have_input == '\0') || (cmd->width == 0)) || (cmd->height == 0)) ||
     (cmd->coding < OMX_RK_VIDEO_CodingMPEG2)) {
    printf("Warning: missing needed parameters for vpu api demo\n");
  }
  if (pInFile[1]._unused2[4] == '\0') {
    printf("please set input bitstream file\n");
    decOut._28_4_ = 0xffffff9b;
  }
  else {
    pcVar7 = "encode";
    if (*(int *)&pInFile->_IO_read_ptr == 1) {
      pcVar7 = "decode";
    }
    printf("input bitstream w: %d, h: %d, coding: %d(%s), path: %s\n",(ulong)(uint)pInFile->_flags,
           (ulong)*(uint *)&pInFile->field_0x4,(ulong)*(uint *)((long)&pInFile->_IO_read_ptr + 4),
           pcVar7,&pInFile->_IO_read_end);
    pOutFile = (FILE *)fopen((char *)&pInFile->_IO_read_end,"rb");
    if ((FILE *)pOutFile == (FILE *)0x0) {
      printf("input file not exsist\n");
      decOut._28_4_ = 0xffffff9b;
    }
    else {
      if (pInFile[1]._unused2[5] != '\0') {
        printf("vpu api demo output file: %s\n",pInFile + 1);
        _pkt_size = fopen((char *)(pInFile + 1),"wb");
        if (_pkt_size == (FILE *)0x0) {
          printf("can not write output file\n");
          decOut._28_4_ = 0xffffff9b;
          goto LAB_00102194;
        }
        if (*(int *)(pInFile[1]._unused2 + 8) == 0) {
          pInFile[1]._unused2[8] = '\x05';
          pInFile[1]._unused2[9] = '\0';
          pInFile[1]._unused2[10] = '\0';
          pInFile[1]._unused2[0xb] = '\0';
        }
      }
      fseek((FILE *)pOutFile,0,2);
      lVar4 = ftell((FILE *)pOutFile);
      ret = (RK_S32)lVar4;
      fseek((FILE *)pOutFile,0,0);
      memset(&pkt,0,0x28);
      pOut = (DecoderOut_t *)&pkt;
      demoPkt.dts = 0;
      pkt = (VideoPacket_t *)0x8000000000000000;
      demoPkt.pts = -0x8000000000000000;
      memset(&demoPkt.nFlags,0,0x20);
      frame = (VPU_FRAME *)&demoPkt.nFlags;
      RVar2 = (*vpuapi_open_ctx)(&ctx);
      if ((RVar2 == 0) && (ctx != (VpuCodecContext_t *)0x0)) {
        RVar2 = readBytesFromFile((RK_U8 *)&hAlign16,4,pOutFile);
        if (RVar2 == 0) {
          printf("codec extra data size: %d\n");
          _wAlign16 = (RK_U8 *)malloc((ulong)hAlign16);
          if (_wAlign16 == (RK_U8 *)0x0) {
            decOut._28_4_ = 0xffffff98;
          }
          else {
            memset(_wAlign16,0,(ulong)hAlign16);
            RVar2 = readBytesFromFile(_wAlign16,hAlign16,pOutFile);
            if (RVar2 == 0) {
              ctx->codecType = *(CODEC_TYPE *)&pInFile->_IO_read_ptr;
              ctx->videoCoding = *(OMX_RK_VIDEO_CODINGTYPE *)((long)&pInFile->_IO_read_ptr + 4);
              ctx->width = pInFile->_flags;
              ctx->height = *(RK_U32 *)&pInFile->field_0x4;
              ctx->no_thread = 1;
              uVar3 = (*ctx->init)(ctx,_wAlign16,hAlign16);
              if (uVar3 == 0) {
                printf("init vpu api context ok, fileSize: %d\n",(ulong)(uint)ret);
                do {
                  lVar4 = ftell((FILE *)pOutFile);
                  if (ret <= lVar4) {
                    printf("read end of file, complete\n");
                    break;
                  }
                  if ((pOut != (DecoderOut_t *)0x0) && (pOut->nFlags == 0)) {
                    RVar2 = readBytesFromFile((RK_U8 *)&frame_count,4,pOutFile);
                    if (RVar2 != 0) break;
                    if (pOut->timeUs == 0) {
                      pvVar5 = malloc((long)(int)frame_count);
                      pOut->timeUs = (RK_S64)pvVar5;
                      if (pOut->timeUs == 0) {
                        decOut._28_4_ = 0xffffff98;
                        goto LAB_00102194;
                      }
                      *(RK_U32 *)&pOut->field_0x1c = frame_count;
                    }
                    if (*(uint *)&pOut->field_0x1c < frame_count) {
                      pvVar5 = realloc((void *)pOut->timeUs,(long)(int)frame_count);
                      pOut->timeUs = (RK_S64)pvVar5;
                      if (pOut->timeUs == 0) {
                        decOut._28_4_ = 0xffffff98;
                        goto LAB_00102194;
                      }
                      *(RK_U32 *)&pOut->field_0x1c = frame_count;
                    }
                    RVar2 = readBytesFromFile((RK_U8 *)pOut->timeUs,frame_count,pOutFile);
                    if (RVar2 != 0) break;
                    pOut->nFlags = frame_count;
                    pOut->data = pExtra;
                    pExtra = pExtra + 40000;
                    uVar3 = pOut->nFlags;
                    pRVar1 = pOut->data;
                    lVar4 = ftell((FILE *)pOutFile);
                    printf("read one packet, size: %d, pts: %lld, filePos: %ld\n",(ulong)uVar3,
                           pRVar1,lVar4);
                  }
                  frame->FrameWidth = 0;
                  RVar2 = (*ctx->decode_sendstream)(ctx,(VideoPacket_t *)pOut);
                  if (RVar2 != 0) {
                    printf("send packet failed");
                    decOut._28_4_ = 0xffffff42;
                    goto LAB_00102194;
                  }
                  RVar2 = (*ctx->decode_getframe)(ctx,(DecoderOut_t *)frame);
                  if (RVar2 != 0) {
                    printf("get decoded data failed\n");
                    decOut._28_4_ = 0xffffff42;
                    goto LAB_00102194;
                  }
                  printf("vpu decode one frame, out len: %d, left size: %d\n",
                         (ulong)frame->FrameWidth,(ulong)(uint)pOut->nFlags);
                  if ((frame->FrameWidth != 0) && (*(long *)frame->FrameBusAddr != 0)) {
                    fakeTimeUs = *(RK_S64 *)frame->FrameBusAddr;
                    (*vpuapi_mem_link)((VPUMemLinear_t *)(fakeTimeUs + 0x40));
                    uVar3 = (*(int *)(fakeTimeUs + 0x18) + 0xfU & 0xfffffff0) *
                            (*(int *)(fakeTimeUs + 0x1c) + 0xfU & 0xfffffff0) * 3 >> 1;
                    if ((_pkt_size != (FILE *)0x0) &&
                       (uVar6 = decOut.nFlags + 1,
                       bVar8 = (uint)decOut.nFlags < *(uint *)(pInFile[1]._unused2 + 8),
                       decOut.nFlags = uVar6, bVar8)) {
                      printf("write %d frame(yuv420sp) data, %d bytes to file\n",(ulong)uVar6,
                             (ulong)uVar3);
                      fwrite(*(void **)(fakeTimeUs + 0x48),1,(ulong)uVar3,_pkt_size);
                      fflush(_pkt_size);
                    }
                    (*vpuapi_mem_free)((VPUMemLinear_t *)(fakeTimeUs + 0x40));
                    free(*(void **)frame->FrameBusAddr);
                    frame->FrameBusAddr[0] = 0;
                    frame->FrameBusAddr[1] = 0;
                    frame->FrameWidth = 0;
                  }
                  usleep(3000);
                } while (ctx->decoder_err == 0);
                decOut._28_4_ = 0;
              }
              else {
                printf("init vpu api context fail, ret: 0x%X\n",(ulong)uVar3);
                decOut._28_4_ = 0xffffff97;
              }
            }
            else {
              decOut._28_4_ = 0xffffff99;
            }
          }
        }
        else {
          decOut._28_4_ = 0xffffff99;
        }
      }
      else {
        decOut._28_4_ = 0xffffff98;
      }
    }
  }
LAB_00102194:
  if ((pOut != (DecoderOut_t *)0x0) && (pOut->timeUs != 0)) {
    free((void *)pOut->timeUs);
    pOut->timeUs = 0;
  }
  if ((frame != (VPU_FRAME *)0x0) && (*(long *)frame->FrameBusAddr != 0)) {
    free(*(void **)frame->FrameBusAddr);
    frame->FrameBusAddr[0] = 0;
    frame->FrameBusAddr[1] = 0;
  }
  if (_wAlign16 != (RK_U8 *)0x0) {
    free(_wAlign16);
    _wAlign16 = (RK_U8 *)0x0;
  }
  if (ctx != (VpuCodecContext_t *)0x0) {
    (*vpuapi_close_ctx)(&ctx);
    ctx = (VpuCodecContext_t *)0x0;
  }
  if (pOutFile != (FILE *)0x0) {
    fclose((FILE *)pOutFile);
    pOutFile = (FILE *)0x0;
  }
  if (_pkt_size != (FILE *)0x0) {
    fclose(_pkt_size);
    _pkt_size = (FILE *)0x0;
  }
  if (decOut._28_4_ == 0) {
    printf("encode demo complete OK.\n");
  }
  else {
    printf("decode demo fail, err: %d\n",(ulong)(uint)decOut._28_4_);
  }
  return decOut._28_4_;
}

Assistant:

static RK_S32 vpu_decode_demo(VpuApiDemoCmdContext_t *cmd)
{
    FILE *pInFile = NULL;
    FILE *pOutFile = NULL;
    RK_S32 fileSize = 0, pkt_size = 0;
    RK_S32 ret = 0;
    RK_U32 frame_count = 0;
    DecoderOut_t    decOut;
    VideoPacket_t demoPkt;
    VideoPacket_t *pkt = NULL;
    DecoderOut_t *pOut = NULL;
    VPU_FRAME *frame = NULL;
    RK_S64 fakeTimeUs = 0;
    RK_U8 *pExtra = NULL;
    RK_U32 extraSize = 0;
    RK_U32 wAlign16  = 0;
    RK_U32 hAlign16  = 0;
    RK_U32 frameSize = 0;

    if (cmd == NULL) {
        return -1;
    }

    if ((cmd->have_input == 0) || (cmd->width <= 0) || (cmd->height <= 0)
        || (cmd->coding <= OMX_RK_VIDEO_CodingAutoDetect)) {
        printf("Warning: missing needed parameters for vpu api demo\n");
    }

    if (cmd->have_input) {
        printf("input bitstream w: %d, h: %d, coding: %d(%s), path: %s\n",
               cmd->width, cmd->height, cmd->coding,
               cmd->codec_type == CODEC_DECODER ? "decode" : "encode",
               cmd->input_file);

        pInFile = fopen(cmd->input_file, "rb");
        if (pInFile == NULL) {
            printf("input file not exsist\n");
            DECODE_ERR_RET(ERROR_INVALID_PARAM);
        }
    } else {
        printf("please set input bitstream file\n");
        DECODE_ERR_RET(ERROR_INVALID_PARAM);
    }

    if (cmd->have_output) {
        printf("vpu api demo output file: %s\n",
               cmd->output_file);
        pOutFile = fopen(cmd->output_file, "wb");
        if (pOutFile == NULL) {
            printf("can not write output file\n");
            DECODE_ERR_RET(ERROR_INVALID_PARAM);
        }
        if (cmd->record_frames == 0)
            cmd->record_frames = 5;
    }

    fseek(pInFile, 0L, SEEK_END);
    fileSize = ftell(pInFile);
    fseek(pInFile, 0L, SEEK_SET);

    memset(&demoPkt, 0, sizeof(VideoPacket_t));
    pkt = &demoPkt;
    pkt->data = NULL;
    pkt->pts = VPU_API_NOPTS_VALUE;
    pkt->dts = VPU_API_NOPTS_VALUE;

    memset(&decOut, 0, sizeof(DecoderOut_t));
    pOut = &decOut;

    ret = vpuapi_open_ctx(&ctx);
    if (ret || (ctx == NULL)) {
        DECODE_ERR_RET(ERROR_MEMORY);
    }

    /*
     ** read codec extra data from input stream file.
    */
    if (readBytesFromFile((RK_U8 *)(&extraSize), 4, pInFile)) {
        DECODE_ERR_RET(ERROR_IO);
    }

    printf("codec extra data size: %d\n", extraSize);

    pExtra = (RK_U8 *)(malloc)(extraSize);
    if (pExtra == NULL) {
        DECODE_ERR_RET(ERROR_MEMORY);
    }
    memset(pExtra, 0, extraSize);

    if (readBytesFromFile(pExtra, extraSize, pInFile)) {
        DECODE_ERR_RET(ERROR_IO);
    }

    /*
     ** now init vpu api context. codecType, codingType, width ,height
     ** are all needed before init.
    */
    ctx->codecType = cmd->codec_type;
    ctx->videoCoding = cmd->coding;
    ctx->width = cmd->width;
    ctx->height = cmd->height;
    ctx->no_thread = 1;

    if ((ret = ctx->init(ctx, pExtra, extraSize)) != 0) {
        printf("init vpu api context fail, ret: 0x%X\n", ret);
        DECODE_ERR_RET(ERROR_INIT_VPU);
    }

    /*
     ** vpu api decoder process.
    */
    printf("init vpu api context ok, fileSize: %d\n", fileSize);

    do {
        if (ftell(pInFile) >= fileSize) {
            printf("read end of file, complete\n");
            break;
        }

        if (pkt && (pkt->size == 0)) {
            if (readBytesFromFile((RK_U8 *)(&pkt_size), 4, pInFile)) {
                break;
            }

            if (pkt->data == NULL) {
                pkt->data = (RK_U8 *)(malloc)(pkt_size);
                if (pkt->data == NULL) {
                    DECODE_ERR_RET(ERROR_MEMORY);
                }
                pkt->capability = pkt_size;
            }

            if (pkt->capability < ((RK_U32)pkt_size)) {
                pkt->data = (RK_U8 *)(realloc)((void *)(pkt->data), pkt_size);
                if (pkt->data == NULL) {
                    DECODE_ERR_RET(ERROR_MEMORY);
                }
                pkt->capability = pkt_size;
            }

            if (readBytesFromFile(pkt->data, pkt_size, pInFile)) {
                break;
            } else {
                pkt->size = pkt_size;
                pkt->pts = fakeTimeUs;
                fakeTimeUs += 40000;
            }

            printf("read one packet, size: %d, pts: %lld, filePos: %ld\n",
                   pkt->size, pkt->pts, ftell(pInFile));
        }

        /* note: must set out put size to 0 before do decoder. */
        pOut->size = 0;

        if (ctx->decode_sendstream(ctx, pkt) != 0) {
            printf("send packet failed");
            DECODE_ERR_RET(ERROR_VPU_DECODE);
        }


        if ((ret = ctx->decode_getframe(ctx, pOut)) != 0) {
            printf("get decoded data failed\n");
            DECODE_ERR_RET(ERROR_VPU_DECODE);
        } else {
            printf("vpu decode one frame, out len: %d, left size: %d\n",
                   pOut->size, pkt->size);

            /*
             ** both virtual and physical address of the decoded frame are contained
             ** in structure named VPU_FRAME, if you want to use virtual address, make
             ** sure you have done VPUMemLink before.
            */
            if ((pOut->size) && (pOut->data)) {
                frame = (VPU_FRAME *)(pOut->data);
                vpuapi_mem_link(&frame->vpumem);
                wAlign16 = ((frame->DisplayWidth + 15) & (~15));
                hAlign16 = ((frame->DisplayHeight + 15) & (~15));
                frameSize = wAlign16 * hAlign16 * 3 / 2;

                if (pOutFile && (frame_count++ < cmd->record_frames)) {
                    printf("write %d frame(yuv420sp) data, %d bytes to file\n",
                           frame_count, frameSize);

                    fwrite((RK_U8 *)(frame->vpumem.vir_addr), 1, frameSize, pOutFile);
                    fflush(pOutFile);
                }

                /*
                 ** remember use VPUFreeLinear to free, other wise memory leak will
                 ** give you a surprise.
                */
                vpuapi_mem_free(&frame->vpumem);
                // NOTE: pOut->data is malloc from vpu_api we need to free it.
                free(pOut->data);
                pOut->data = NULL;
                pOut->size = 0;
            }
        }

        usleep(3000);
    } while (!(ctx->decoder_err));

DECODE_OUT:
    if (pkt && pkt->data) {
        free(pkt->data);
        pkt->data = NULL;
    }
    if (pOut && (pOut->data)) {
        free(pOut->data);
        pOut->data = NULL;
    }
    if (pExtra) {
        free(pExtra);
        pExtra = NULL;
    }
    if (ctx) {
        vpuapi_close_ctx(&ctx);
        ctx = NULL;
    }
    if (pInFile) {
        fclose(pInFile);
        pInFile = NULL;
    }
    if (pOutFile) {
        fclose(pOutFile);
        pOutFile = NULL;
    }

    if (ret) {
        printf("decode demo fail, err: %d\n", ret);
    } else {
        printf("encode demo complete OK.\n");
    }
    return ret;
}